

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmXMLWriter *xml,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler,string *makeFlags
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *makeFlags_00;
  size_type sVar3;
  cmGeneratorTarget *this_00;
  long *plVar4;
  TargetType TVar5;
  char *pcVar6;
  cmExtraCodeBlocksGenerator *this_01;
  const_iterator cVar7;
  cmXMLWriter *this_02;
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer value;
  cmMakefile *pcVar9;
  string workingDir;
  string location;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  int cbTargetType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allIncludeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string makefileName;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  cmGeneratorTarget *local_e8;
  allocator local_d9;
  cmExtraCodeBlocksGenerator *local_d8;
  char *local_d0;
  cmMakefile *local_c8;
  int local_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long *local_60 [2];
  long local_50 [2];
  string *local_40;
  cmLocalGenerator *local_38;
  
  pcVar9 = lg->Makefile;
  local_e8 = target;
  local_d8 = this;
  local_d0 = make;
  pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_60,pcVar6,(allocator *)&local_168);
  std::__cxx11::string::append((char *)local_60);
  paVar8 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Target","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  this_02 = xml;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"title",targetName);
  if (local_e8 == (cmGeneratorTarget *)0x0) {
    local_168._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Option","");
    cmXMLWriter::StartElement(xml,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar8) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_168._M_dataplus._M_p = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    cmXMLWriter::Attribute<char_const*>(xml,"working_dir",(char **)&local_168);
    cmXMLWriter::EndElement(xml);
    local_168._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Option","");
    cmXMLWriter::StartElement(xml,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar8) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_168._M_dataplus._M_p._0_4_ = 4;
    cmXMLWriter::Attribute<int>(xml,"type",(int *)&local_168);
    cmXMLWriter::EndElement(xml);
  }
  else {
    local_bc = GetCBTargetType((cmExtraCodeBlocksGenerator *)this_02,local_e8);
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&local_168,pcVar6,(allocator *)&local_128);
    local_40 = targetName;
    TVar5 = cmGeneratorTarget::GetType(local_e8);
    local_c8 = pcVar9;
    if (TVar5 == EXECUTABLE) {
      paVar8 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"CMAKE_RUNTIME_OUTPUT_DIRECTORY","");
      pcVar6 = cmMakefile::GetDefinition(pcVar9,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar8) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (pcVar6 == (char *)0x0) {
        local_128._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"EXECUTABLE_OUTPUT_PATH","");
        pcVar6 = cmMakefile::GetDefinition(pcVar9,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar8) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (char *)0x0) {
          strlen(pcVar6);
          pcVar9 = local_c8;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_168,0,(char *)local_168._M_string_length,(ulong)pcVar6);
        }
      }
      else {
        strlen(pcVar6);
        pcVar9 = local_c8;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_168,0,(char *)local_168._M_string_length,(ulong)pcVar6);
      }
    }
    paVar8 = &local_148.field_2;
    local_148._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"CMAKE_BUILD_TYPE","");
    this_01 = (cmExtraCodeBlocksGenerator *)cmMakefile::GetSafeDefinition(pcVar9,&local_148);
    std::__cxx11::string::string((string *)&local_128,(char *)this_01,(allocator *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar8) {
      this_01 = (cmExtraCodeBlocksGenerator *)
                (CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                          local_148.field_2._M_local_buf[0]) + 1);
      operator_delete(local_148._M_dataplus._M_p,(ulong)this_01);
    }
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_148._M_dataplus._M_p = (pointer)paVar8;
    TVar5 = cmGeneratorTarget::GetType(local_e8);
    if (TVar5 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_(&local_188,this_01,lg,local_e8);
      std::__cxx11::string::operator=((string *)&local_148,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar6 = cmGeneratorTarget::GetLocation(local_e8,&local_128);
      sVar3 = local_148._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)sVar3,(ulong)pcVar6);
    }
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Option","");
    cmXMLWriter::StartElement(xml,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"output",&local_148);
    local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
    cmXMLWriter::Attribute<int>(xml,"prefix_auto",(int *)&local_188);
    local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
    cmXMLWriter::Attribute<int>(xml,"extension_auto",(int *)&local_188);
    cmXMLWriter::EndElement(xml);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Option","");
    cmXMLWriter::StartElement(xml,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"working_dir",&local_168);
    cmXMLWriter::EndElement(xml);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Option","");
    cmXMLWriter::StartElement(xml,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<char[3]>(xml,"object_output",(char (*) [3])0x55cdf3);
    cmXMLWriter::EndElement(xml);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Option","");
    cmXMLWriter::StartElement(xml,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<int>(xml,"type",&local_bc);
    cmXMLWriter::EndElement(xml);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Option","");
    cmXMLWriter::StartElement(xml,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<char_const*>(xml,"compiler",&compiler);
    cmXMLWriter::EndElement(xml);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Compiler","");
    cmXMLWriter::StartElement(xml,&local_188);
    this_00 = local_e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"C","");
    local_38 = lg;
    cmGeneratorTarget::GetCompileDefinitions(this_00,&local_98,&local_128,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    __rhs = local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Add","");
        cmXMLWriter::StartElement(xml,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_188,"-D",__rhs);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"option",&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        __rhs = __rhs + 1;
      } while (__rhs != local_98.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"C","");
    cmLocalGenerator::GetIncludeDirectories(local_38,&local_78,local_e8,&local_188,&local_128,true);
    pcVar9 = local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS","");
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar9,&local_108);
    std::__cxx11::string::string((string *)&local_188,pcVar6,&local_d9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_188._M_string_length != (char *)0x0) {
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      cmSystemTools::ExpandListArgument
                (&local_188,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_108,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_108._M_dataplus._M_p,
                 local_108._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS","");
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar9,&local_108);
    sVar3 = local_188._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)sVar3,(ulong)pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_188._M_string_length != (char *)0x0) {
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      cmSystemTools::ExpandListArgument
                (&local_188,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_108,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_108._M_dataplus._M_p,
                 local_108._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108);
    }
    cVar7 = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_b8);
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != cVar7._M_current) {
      value = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Add","");
        cmXMLWriter::StartElement(xml,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"directory",value);
        cmXMLWriter::EndElement(xml);
        value = value + 1;
      } while (value != cVar7._M_current);
    }
    cmXMLWriter::EndElement(xml);
    targetName = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  paVar8 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"MakeCommands","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Build","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_128,local_d0,(allocator *)&local_148);
  makeFlags_00 = makeFlags;
  BuildMakeCommand(&local_168,local_d8,&local_128,(char *)local_60[0],targetName,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_128.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"CompileFile","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_128,local_d0,(allocator *)&local_188);
  plVar4 = local_60[0];
  paVar2 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\"$file\"","");
  BuildMakeCommand(&local_168,local_d8,&local_128,(char *)plVar4,&local_148,makeFlags_00);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Clean","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_128,local_d0,(allocator *)&local_188);
  plVar4 = local_60[0];
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"clean","");
  BuildMakeCommand(&local_168,local_d8,&local_128,(char *)plVar4,&local_148,makeFlags_00);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  local_168._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"DistClean","");
  cmXMLWriter::StartElement(xml,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_128,local_d0,(allocator *)&local_188);
  plVar4 = local_60[0];
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"clean","");
  BuildMakeCommand(&local_168,local_d8,&local_128,(char *)plVar4,&local_148,makeFlags_00);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar8) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(
  cmXMLWriter& xml, const std::string& targetName, cmGeneratorTarget* target,
  const char* make, const cmLocalGenerator* lg, const char* compiler,
  const std::string& makeFlags)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  xml.StartElement("Target");
  xml.Attribute("title", targetName);

  if (target != CM_NULLPTR) {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if (target->GetType() == cmStateEnums::EXECUTABLE) {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir =
        makefile->GetDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != CM_NULLPTR) {
        workingDir = runtimeOutputDir;
      } else {
        const char* executableOutputDir =
          makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != CM_NULLPTR) {
          workingDir = executableOutputDir;
        }
      }
    }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      location =
        this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg), target);
    } else {
      location = target->GetLocation(buildType);
    }

    xml.StartElement("Option");
    xml.Attribute("output", location);
    xml.Attribute("prefix_auto", 0);
    xml.Attribute("extension_auto", 0);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("working_dir", workingDir);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("object_output", "./");
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", cbTargetType);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("compiler", compiler);
    xml.EndElement();

    xml.StartElement("Compiler");

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for (std::vector<std::string>::const_iterator di = cdefs.begin();
         di != cdefs.end(); ++di) {
      xml.StartElement("Add");
      xml.Attribute("option", "-D" + *di);
      xml.EndElement();
    }

    // the include directories for this target
    std::vector<std::string> allIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    allIncludeDirs.insert(allIncludeDirs.end(), includes.begin(),
                          includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    std::vector<std::string>::const_iterator end =
      cmRemoveDuplicates(allIncludeDirs);

    for (std::vector<std::string>::const_iterator i = allIncludeDirs.begin();
         i != end; ++i) {
      xml.StartElement("Add");
      xml.Attribute("directory", *i);
      xml.EndElement();
    }

    xml.EndElement(); // Compiler
  } else              // e.g. all and the GLOBAL and UTILITY targets
  {
    xml.StartElement("Option");
    xml.Attribute("working_dir", lg->GetCurrentBinaryDirectory());
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", 4);
    xml.EndElement();
  }

  xml.StartElement("MakeCommands");

  xml.StartElement("Build");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  targetName, makeFlags));
  xml.EndElement();

  xml.StartElement("CompileFile");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "\"$file\"", makeFlags));
  xml.EndElement();

  xml.StartElement("Clean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.StartElement("DistClean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.EndElement(); // MakeCommands
  xml.EndElement(); // Target
}